

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_large_unittest.cc
# Opt level: O1

int main(int argc,char **argv)

{
  _Base_ptr p_Var1;
  const_iterator cVar2;
  undefined8 uVar3;
  const_iterator cVar4;
  char *pcVar5;
  size_t sVar6;
  int iVar7;
  size_t i;
  long lVar8;
  undefined1 local_70 [8];
  set<char_*,_std::less<char_*>,_std::allocator<char_*>_> p_set;
  char *local_38;
  char *p;
  
  iVar7 = 0;
  printf("Test malloc(0) x %d\n",0x400);
  p_set._M_t._M_impl._0_4_ = 0;
  p_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_set._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  p_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  p_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&p_set;
  p_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&p_set;
  while( true ) {
    local_38 = (char *)operator_new(1);
    cVar2._M_node = (_Base_ptr)&p_set;
    for (p_Var1 = (_Base_ptr)p_set._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
        p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[*(char **)(p_Var1 + 1) < local_38]) {
      if (*(char **)(p_Var1 + 1) >= local_38) {
        cVar2._M_node = p_Var1;
      }
    }
    cVar4._M_node = (_Base_ptr)&p_set;
    if ((cVar2._M_node != (_Base_ptr)&p_set) &&
       (cVar4._M_node = cVar2._M_node, local_38 < *(char **)(cVar2._M_node + 1))) {
      cVar4._M_node = (_Base_ptr)&p_set;
    }
    if (cVar4._M_node != (_Base_ptr)&p_set) break;
    p_set._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_70;
    std::_Rb_tree<char*,char*,std::_Identity<char*>,std::less<char*>,std::allocator<char*>>::
    _M_insert_unique_<char*const&,std::_Rb_tree<char*,char*,std::_Identity<char*>,std::less<char*>,std::allocator<char*>>::_Alloc_node>
              ((_Rb_tree<char*,char*,std::_Identity<char*>,std::less<char*>,std::allocator<char*>> *
               )local_70,(_Base_ptr)&p_set,&local_38,
               (_Alloc_node *)&p_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
    iVar7 = iVar7 + 1;
    if (iVar7 == 0x400) {
      std::
      _Rb_tree<char_*,_char_*,_std::_Identity<char_*>,_std::less<char_*>,_std::allocator<char_*>_>::
      ~_Rb_tree((_Rb_tree<char_*,_char_*,_std::_Identity<char_*>,_std::less<char_*>,_std::allocator<char_*>_>
                 *)local_70);
      puts("Test small malloc");
      local_70 = (undefined1  [8])malloc(0x400000);
      (*noopt_helper)((_Rb_tree<char_*,_char_*,_std::_Identity<char_*>,_std::less<char_*>,_std::allocator<char_*>_>
                       *)local_70);
      if (local_70 != (undefined1  [8])0x0) {
        puts("Test malloc(0 - N)");
        sVar6 = 0xffffffffffffffff;
        do {
          TryAllocExpectFail(sVar6);
          sVar6 = sVar6 - 1;
        } while (sVar6 != 0xffffffffffffc000);
        puts("Test malloc(0 - 1048576 - N)");
        sVar6 = 0xfffffffffff00000;
        do {
          TryAllocExpectFail(sVar6);
          sVar6 = sVar6 - 1;
        } while (sVar6 != 0xffffffffffefc000);
        puts("Test malloc(max/2 +- N)");
        lVar8 = 0;
        sVar6 = 0x8000000000000000;
        do {
          TryAllocMightFail(sVar6);
          TryAllocMightFail(lVar8 + 0x8000000000000000);
          lVar8 = lVar8 + 1;
          sVar6 = sVar6 - 1;
        } while (lVar8 != 0x40);
        puts("PASS");
        return 0;
      }
      pcVar5 = "Check failed: p_small != nullptr\n";
      uVar3 = 0x21;
LAB_001025ce:
      syscall(1,2,pcVar5,uVar3);
      abort();
    }
  }
  pcVar5 = "Check failed: p_set.find(p) == p_set.end()\n";
  uVar3 = 0x2b;
  goto LAB_001025ce;
}

Assistant:

int main (int argc, char** argv) {
  // Allocate some 0-byte objects.  They better be unique.
  // 0 bytes is not large but it exercises some paths related to
  // large-allocation code.
  {
    static const int kZeroTimes = 1024;
    printf("Test malloc(0) x %d\n", kZeroTimes);
    set<char*> p_set;
    for ( int i = 0; i < kZeroTimes; ++i ) {
      char* p = new char;
      CHECK(p != nullptr);
      CHECK(p_set.find(p) == p_set.end());
      p_set.insert(p_set.end(), p);
    }
    // Just leak the memory.
  }

  // Grab some memory so that some later allocations are guaranteed to fail.
  printf("Test small malloc\n");
  void* p_small = noopt(malloc(4*1048576));
  CHECK(p_small != nullptr);

  // Test sizes up near the maximum size_t.
  // These allocations test the wrap-around code.
  printf("Test malloc(0 - N)\n");
  const size_t zero = 0;
  static const size_t kMinusNTimes = 16384;
  for ( size_t i = 1; i < kMinusNTimes; ++i ) {
    TryAllocExpectFail(zero - i);
  }

  // Test sizes a bit smaller.
  // The small malloc above guarantees that all these return nullptr.
  printf("Test malloc(0 - 1048576 - N)\n");
  static const size_t kMinusMBMinusNTimes = 16384;
  for ( size_t i = 0; i < kMinusMBMinusNTimes; ++i) {
    TryAllocExpectFail(zero - 1048576 - i);
  }

  // Test sizes at half of size_t.
  // These might or might not fail to allocate.
  printf("Test malloc(max/2 +- N)\n");
  static const size_t kHalfPlusMinusTimes = 64;
  const size_t half = (zero - 2) / 2 + 1;
  for ( size_t i = 0; i < kHalfPlusMinusTimes; ++i) {
    TryAllocMightFail(half - i);
    TryAllocMightFail(half + i);
  }

  printf("PASS\n");
  return 0;
}